

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O1

void __thiscall CTestResource_TestMSAA_Test::TestBody(CTestResource_TestMSAA_Test *this)

{
  int iVar1;
  _Tuple_impl<5UL,_int> _Var2;
  TEST_BPP Bpp;
  double dVar3;
  bool bVar4;
  bool bVar5;
  CTestResource_TestMSAA_Test *pCVar6;
  pointer ptVar7;
  CTestResource_TestMSAA_Test *pCVar8;
  ulong uVar9;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  undefined1 auVar10 [8];
  long lVar11;
  int iVar12;
  uint uVar13;
  anon_union_8_3_ffc73876_for_GMM_RESCREATE_PARAMS_REC_6 aVar14;
  int iVar15;
  uint uVar16;
  uint32_t uVar17;
  int iVar18;
  undefined1 auStack_138 [8];
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_f8;
  ulong local_78;
  uint32_t local_70;
  uint local_6c;
  uint32_t ExpectedMCSBpp;
  double local_60;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t MCSHAlign;
  uint32_t MCSVAlign;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t VAlign;
  uint32_t TileDimY;
  uint32_t HAlign;
  byte local_31;
  uint32_t TileDimX;
  
  auStack_138 = (undefined1  [8])0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)auStack_138,3,2,false);
  ptVar7 = List.
           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar8 = this;
  auVar10 = auStack_138;
  pCVar6 = _MCSHAlign;
  do {
    _MCSHAlign = pCVar8;
    if (auVar10 == (undefined1  [8])ptVar7) {
      if (auStack_138 != (undefined1  [8])0x0) {
        _MCSHAlign = pCVar6;
        operator_delete((void *)auStack_138);
      }
      return;
    }
    _Var2.super__Head_base<5UL,_int,_false>._M_head_impl =
         (((pointer)auVar10)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
         super__Tuple_impl<4UL,_int,_int>.super__Tuple_impl<5UL,_int>.
         super__Head_base<5UL,_int,_false>;
    lVar11 = (long)(((pointer)auVar10)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                   super__Tuple_impl<2UL,_int,_bool,_int,_int>.
                   super__Tuple_impl<3UL,_bool,_int,_int>.super__Tuple_impl<4UL,_int,_int>.
                   super__Head_base<4UL,_int,_false>._M_head_impl;
    local_31 = (((pointer)auVar10)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
               super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
               super__Head_base<3UL,_bool,_false>._M_head_impl;
    Bpp = (((pointer)auVar10)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
          super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Head_base<1UL,_int,_false>.
          _M_head_impl;
    TileDimY = (((pointer)auVar10)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Head_base<0UL,_int,_false>._M_head_impl;
    local_f8.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_f8.MultiTileArch._0_1_ = 0;
    local_f8.MultiTileArch.GpuVaMappingSet = '\0';
    local_f8.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_f8.MultiTileArch.LocalMemPreferredSet = '\0';
    local_f8.MultiTileArch.Reserved = 0;
    local_f8.ExistingSysMemSize = 0;
    local_f8.MaximumRenamingListLength = 0;
    local_f8.NoGfxMemory = '\0';
    local_f8._109_3_ = 0;
    local_f8.RotateInfo = 0;
    local_f8._84_4_ = 0;
    local_f8.pExistingSysMem = 0;
    local_f8.MaxLod = 0;
    local_f8.ArraySize = 0;
    local_f8.BaseAlignment = 0;
    local_f8.OverridePitch = 0;
    local_f8.field_6.BaseWidth64 = 0;
    local_f8.BaseHeight = 0;
    local_f8.Depth = 0;
    local_f8.MSAA.NumSamples = 0;
    local_f8.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_f8.CpTag = 0;
    local_f8._44_4_ = 0;
    local_f8.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_f8.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_f8.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_f8.Type = RESOURCE_INVALID;
    local_f8.Format = GMM_FORMAT_INVALID;
    local_f8.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    if ((int)TileDimY < 3 &&
        (((pointer)auVar10)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_bool,_int,_int>
        .super__Head_base<2UL,_int,_false>._M_head_impl == 1) {
      if ((local_31 & 1) == 0) {
        if ((TileDimY == TEST_TILEX) || (1 < Bpp - TEST_BPP_16)) goto LAB_0018119a;
        CTestResource::SetTileFlag(&this->super_CTestResource,&local_f8,TileDimY);
        uVar9 = 0x40;
        if ((local_31 & 1) != 0) {
          uVar9 = 0x800000;
        }
      }
      else {
        CTestResource::SetTileFlag(&this->super_CTestResource,&local_f8,TileDimY);
        uVar9 = 0x800000;
      }
      local_f8.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_f8.Flags.Gpu & 0xffffffffff7fffbf | uVar9);
      local_f8.ArraySize =
           *(uint32_t *)
            (&DAT_001ad518 + (long)(int)_Var2.super__Head_base<5UL,_int,_false>._M_head_impl * 4);
      local_f8.NoGfxMemory = '\x01';
      local_f8.Format = GMM_FORMAT_INVALID;
      if (Bpp < TEST_BPP_MAX) {
        local_f8.Format = (&DAT_001ad6d0)[Bpp];
      }
      local_60 = (double)Bpp;
      local_f8.Type = RESOURCE_2D;
      uVar9 = 1;
      local_6c = local_31 & 1;
      do {
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  (&this->super_CTestResource,Bpp,SUB41(local_6c,0),TileDimY,(TEST_MSAA)uVar9,
                   &HAlign,&local_44,&VAlign,&local_48,&local_70,&local_58,&local_54);
        local_f8.field_6.BaseWidth = HAlign * *(int *)(&DAT_001ad500 + lVar11 * 8) + 1;
        local_f8.field_6.BaseWidth64._4_4_ = 0;
        local_f8.Depth = 1;
        local_f8.BaseHeight = local_44 * *(int *)(&DAT_001ad504 + lVar11 * 8) + 1;
        local_78 = uVar9;
        dVar3 = exp2((double)(int)(TEST_MSAA)uVar9);
        local_f8.MSAA.NumSamples = (uint32_t)(long)dVar3;
        local_f8.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_f8.Flags.Gpu & 0xffffffffffff7fff);
        local_f8.ArraySize = 1;
        ResourceInfo = (GMM_RESOURCE_INFO *)
                       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                 (CommonULT::pGmmULTClientContext,&local_f8);
        if (ResourceInfo == (GMM_RESOURCE_INFO *)0x0) goto LAB_00181175;
        CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,ResourceInfo,VAlign);
        CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,ResourceInfo,local_48);
        if ((local_31 & 1) != 0) {
          uVar13 = (VAlign - 1) + local_f8.field_6.BaseWidth;
          uVar16 = -VAlign;
          dVar3 = exp2(local_60);
          iVar12 = (int)(long)dVar3 * (uVar16 & uVar13) + HAlign;
          uVar13 = (VAlign - 1) + local_f8.field_6.BaseWidth;
          uVar16 = -VAlign;
          dVar3 = exp2(local_60);
          uVar17 = ~((int)(long)dVar3 * (uVar16 & uVar13) + -1 + HAlign & HAlign - 1) + iVar12;
          CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,uVar17);
          if (TileDimY != 0) {
            CTestResource::VerifyResourcePitchInTiles<true>
                      (&this->super_CTestResource,ResourceInfo,uVar17 / HAlign);
          }
          uVar13 = -local_48 & (local_f8.BaseHeight - 1) + local_48;
          CTestResource::VerifyResourceQPitch<true>
                    (&this->super_CTestResource,ResourceInfo,(ulong)uVar13);
          CTestResource::VerifyResourceSize<true>
                    (&this->super_CTestResource,ResourceInfo,
                     (ulong)((-local_44 &
                             (local_44 - 1) + uVar13 * local_f8.MSAA.NumSamples * local_f8.ArraySize
                             ) * uVar17 + 0xfff & 0xfffff000));
          goto LAB_00181083;
        }
        iVar12 = (int)local_78;
        switch(iVar12) {
        case 1:
          iVar18 = 2;
          bVar5 = false;
          goto LAB_00180f45;
        case 2:
          iVar18 = 2;
          goto LAB_00180f41;
        case 3:
          iVar12 = 2;
          iVar18 = 4;
          bVar4 = true;
          bVar5 = true;
          break;
        case 4:
          iVar18 = 4;
LAB_00180f41:
          bVar5 = true;
LAB_00180f45:
          bVar4 = true;
          break;
        default:
          iVar12 = 1;
          iVar18 = 1;
          bVar4 = false;
          bVar5 = false;
        }
        aVar14.BaseWidth64 = local_f8.field_6.BaseWidth64 + 1 & 0xfffffffffffffffe;
        if (!bVar4) {
          aVar14 = local_f8.field_6;
        }
        uVar13 = local_f8.BaseHeight + 1 & 0xfffffffe;
        if (!bVar5) {
          uVar13 = local_f8.BaseHeight;
        }
        local_f8.BaseHeight = uVar13;
        iVar1 = VAlign - 1;
        uVar13 = -VAlign;
        local_f8.field_6 = aVar14;
        _ExpectedMCSBpp = ResourceInfo;
        dVar3 = exp2(local_60);
        iVar15 = (int)(long)dVar3 * (uVar13 & iVar1 + aVar14.BaseWidth * iVar18) + HAlign;
        iVar18 = iVar18 * local_f8.field_6.BaseWidth;
        iVar1 = VAlign - 1;
        uVar13 = -VAlign;
        dVar3 = exp2(local_60);
        pCVar6 = _MCSHAlign;
        uVar17 = ~((int)(long)dVar3 * (uVar13 & iVar1 + iVar18) + -1 + HAlign & HAlign - 1) + iVar15
        ;
        CTestResource::VerifyResourcePitch<true>
                  (&_MCSHAlign->super_CTestResource,_ExpectedMCSBpp,uVar17);
        if (TileDimY != 0) {
          CTestResource::VerifyResourcePitchInTiles<true>
                    (&pCVar6->super_CTestResource,_ExpectedMCSBpp,uVar17 / HAlign);
        }
        ResourceInfo = _ExpectedMCSBpp;
        uVar13 = -local_48 & (local_48 - 1) + iVar12 * local_f8.BaseHeight;
        if (1 < local_f8.ArraySize) {
          CTestResource::VerifyResourceQPitch<true>
                    (&_MCSHAlign->super_CTestResource,_ExpectedMCSBpp,(ulong)uVar13);
        }
        this = _MCSHAlign;
        CTestResource::VerifyResourceSize<true>
                  (&_MCSHAlign->super_CTestResource,ResourceInfo,
                   (ulong)((-local_44 & (local_44 - 1) + uVar13 * local_f8.ArraySize) * uVar17 +
                           0xfff & 0xfffff000));
LAB_00181083:
        local_f8.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_f8.Flags.Gpu | 0x8000)
        ;
        ResourceInfo_00 =
             (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_f8);
        CTestResource::VerifyResourceHAlign<true>
                  (&this->super_CTestResource,ResourceInfo_00,local_58);
        CTestResource::VerifyResourceVAlign<true>
                  (&this->super_CTestResource,ResourceInfo_00,local_54);
        uVar13 = (-local_58 & (local_58 - 1) + local_f8.field_6.BaseWidth) * local_70 + 0x7f;
        uVar16 = uVar13 & 0xffffff80;
        CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo_00,uVar16);
        CTestResource::VerifyResourcePitchInTiles<true>
                  (&this->super_CTestResource,ResourceInfo_00,uVar13 >> 7);
        this = _MCSHAlign;
        uVar13 = local_f8.BaseHeight;
        if (1 < local_f8.ArraySize) {
          uVar13 = -local_54 & (local_f8.BaseHeight - 1) + local_54;
          CTestResource::VerifyResourceQPitch<true>
                    (&_MCSHAlign->super_CTestResource,ResourceInfo_00,(ulong)uVar13);
        }
        CTestResource::VerifyResourceSize<true>
                  (&this->super_CTestResource,ResourceInfo_00,
                   (ulong)((uVar13 * local_f8.ArraySize + 0x1f & 0xffffffe0) * uVar16));
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo_00);
LAB_00181175:
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo);
        uVar13 = (int)local_78 + 1;
        uVar9 = (ulong)uVar13;
      } while (uVar13 != 4);
    }
LAB_0018119a:
    auVar10 = (undefined1  [8])((long)auVar10 + 0x18);
    pCVar8 = _MCSHAlign;
    pCVar6 = _MCSHAlign;
  } while( true );
}

Assistant:

TEST_F(CTestResource, TestMSAA)
{
    enum MSAA_Samples
    {
        MSAA_None,
        MSAA_2x,
        MSAA_4x,
        MSAA_8x,
        MSAA_16x
    };

    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen8:No mip-map for MSAA (MSS and MCS), No 16x
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //QPitch exists for arrayed MSS - gives distance between slices
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //                 MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[3][2] = {
    {0, 0}, //1x1x1
    {1, 0}, //2 Tilesx1
    {1, 1}, //2 Tilesx 2
    };

    uint32_t TestArraySize[2] = {1, 7};

    uint32_t HAlign, VAlign, TileDimX, TileDimY, MCSHAlign, MCSVAlign, TileSize;
    uint32_t ExpectedMCSBpp;

    std::vector<std::tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, TestArraySize index
    auto Size = BuildInputIterator(List, 3, 2, false);                  // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling > TEST_TILEY           //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k < MSAA_16x; k++) //No 16x MSAA on Gen8
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64 = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight  = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;

            gmmParams.Depth           = 0x1; //2D Res_type with Depth > 1 doesn't fail, although Tex_cacl doesn't use it
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;
            gmmParams.ArraySize       = 1;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    //if (gmmParams.ArraySize > 1) - Arrayed MSS has QPitch
                    {
                        ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); //AlignedWidth*bpp, then align to Tile
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX); // 1 tileY wide
                    }

                    uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        // it needs to be in VALign multiple
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign); // MCS alignment same as basic RT alignment
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); //AlignedWidth*bpp, then tile-alignment
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = gmmParams.BaseHeight;
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all input tuples
}